

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printPCRelOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  int32_t val;
  SStream *O_00;
  int64_t iVar3;
  uint8_t *puVar4;
  uint in_ESI;
  MCInst *in_RDI;
  int32_t imm;
  MCOperand *MO;
  
  O_00 = (SStream *)MCInst_getOperand(in_RDI,in_ESI);
  _Var2 = MCOperand_isImm((MCOperand *)O_00);
  if (_Var2) {
    iVar3 = MCOperand_getImm((MCOperand *)O_00);
    val = (int32_t)iVar3;
    printInt32(O_00,val);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar4 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x15;
      puVar4[0] = '\x02';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      *(long *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1d) = (long)val;
      pcVar1 = in_RDI->flat_insn->detail;
      (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
    }
  }
  return;
}

Assistant:

static void printPCRelOperand(MCInst *MI, int OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	int32_t imm;

	if (MCOperand_isImm(MO)) {
		imm = (int32_t)MCOperand_getImm(MO);

		printInt32(O, imm);

		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)imm;
			MI->flat_insn->detail->sysz.op_count++;
		}
	}
}